

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::GRULayerParams::SerializeWithCachedSizes
          (GRULayerParams *this,CodedOutputStream *output)

{
  int iVar1;
  Type *value;
  int index;
  
  if (this->inputvectorsize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->inputvectorsize_,output);
  }
  if (this->outputvectorsize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->outputvectorsize_,output);
  }
  iVar1 = (this->activations_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                        (&(this->activations_).super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::WriteMessage(10,&value->super_MessageLite,output);
      index = index + 1;
    } while (iVar1 != index);
  }
  if (this->sequenceoutput_ != false) {
    google::protobuf::internal::WireFormatLite::WriteBool(0xf,true,output);
  }
  if (this->hasbiasvectors_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x14,true,output);
  }
  if (this->updategateweightmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1e,&this->updategateweightmatrix_->super_MessageLite,output);
  }
  if (this->resetgateweightmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f,&this->resetgateweightmatrix_->super_MessageLite,output);
  }
  if (this->outputgateweightmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x20,&this->outputgateweightmatrix_->super_MessageLite,output);
  }
  if (this->updategaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x32,&this->updategaterecursionmatrix_->super_MessageLite,output);
  }
  if (this->resetgaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x33,&this->resetgaterecursionmatrix_->super_MessageLite,output);
  }
  if (this->outputgaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x34,&this->outputgaterecursionmatrix_->super_MessageLite,output);
  }
  if (this->updategatebiasvector_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x46,&this->updategatebiasvector_->super_MessageLite,output);
  }
  if (this->resetgatebiasvector_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x47,&this->resetgatebiasvector_->super_MessageLite,output);
  }
  if (this->outputgatebiasvector_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x48,&this->outputgatebiasvector_->super_MessageLite,output);
  }
  if (this->reverseinput_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(100,true,output);
    return;
  }
  return;
}

Assistant:

void GRULayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.GRULayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->inputvectorsize(), output);
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->outputvectorsize(), output);
  }

  // repeated .CoreML.Specification.ActivationParams activations = 10;
  for (unsigned int i = 0, n = this->activations_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, this->activations(i), output);
  }

  // bool sequenceOutput = 15;
  if (this->sequenceoutput() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(15, this->sequenceoutput(), output);
  }

  // bool hasBiasVectors = 20;
  if (this->hasbiasvectors() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(20, this->hasbiasvectors(), output);
  }

  // .CoreML.Specification.WeightParams updateGateWeightMatrix = 30;
  if (this->has_updategateweightmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      30, *this->updategateweightmatrix_, output);
  }

  // .CoreML.Specification.WeightParams resetGateWeightMatrix = 31;
  if (this->has_resetgateweightmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      31, *this->resetgateweightmatrix_, output);
  }

  // .CoreML.Specification.WeightParams outputGateWeightMatrix = 32;
  if (this->has_outputgateweightmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      32, *this->outputgateweightmatrix_, output);
  }

  // .CoreML.Specification.WeightParams updateGateRecursionMatrix = 50;
  if (this->has_updategaterecursionmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      50, *this->updategaterecursionmatrix_, output);
  }

  // .CoreML.Specification.WeightParams resetGateRecursionMatrix = 51;
  if (this->has_resetgaterecursionmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      51, *this->resetgaterecursionmatrix_, output);
  }

  // .CoreML.Specification.WeightParams outputGateRecursionMatrix = 52;
  if (this->has_outputgaterecursionmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      52, *this->outputgaterecursionmatrix_, output);
  }

  // .CoreML.Specification.WeightParams updateGateBiasVector = 70;
  if (this->has_updategatebiasvector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      70, *this->updategatebiasvector_, output);
  }

  // .CoreML.Specification.WeightParams resetGateBiasVector = 71;
  if (this->has_resetgatebiasvector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      71, *this->resetgatebiasvector_, output);
  }

  // .CoreML.Specification.WeightParams outputGateBiasVector = 72;
  if (this->has_outputgatebiasvector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      72, *this->outputgatebiasvector_, output);
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(100, this->reverseinput(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.GRULayerParams)
}